

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# game.h
# Opt level: O0

void __thiscall fpsstate::spawnstate(fpsstate *this,int gamemode)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  bool bVar4;
  int local_20;
  int i;
  int spawngun2;
  int spawngun1;
  int gamemode_local;
  fpsstate *this_local;
  
  if (((gamemode < -3) || (0x16 < gamemode)) || ((gamemodes[gamemode + 3].flags & 0x2000U) == 0)) {
    if (((gamemode < -3) || (0x16 < gamemode)) || ((gamemodes[gamemode + 3].flags & 8U) == 0)) {
      if (((gamemode < -3) || (0x16 < gamemode)) ||
         ((gamemodes[gamemode + 3].flags & 0xc0U) != 0xc0)) {
        if (((gamemode < -3) || (0x16 < gamemode)) || ((gamemodes[gamemode + 3].flags & 0x20U) == 0)
           ) {
          if (((gamemode < -3) || (0x16 < gamemode)) ||
             ((gamemodes[gamemode + 3].flags & 0x10U) == 0)) {
            if ((((gamemode < -3) || (0x16 < gamemode)) ||
                ((gamemodes[gamemode + 3].flags & 0x100U) == 0)) &&
               (((gamemode < -3 || (0x16 < gamemode)) ||
                ((gamemodes[gamemode + 3].flags & 0x80000U) == 0)))) {
              if (((gamemode < -3) || (0x16 < gamemode)) ||
                 ((gamemodes[gamemode + 3].flags & 0x30000U) == 0)) {
                this->armourtype = 0;
                this->armour = 0x19;
                this->ammo[6] = 0x28;
                this->ammo[5] = 1;
              }
              else {
                if (((-4 < gamemode) && (gamemode < 0x17)) &&
                   ((gamemodes[gamemode + 3].flags & 0x10000U) != 0)) {
                  this->armourtype = 0;
                  this->armour = 0x19;
                }
                this->ammo[6] = 0x50;
                this->ammo[5] = 1;
              }
            }
            else {
              this->armourtype = 0;
              this->armour = 0x32;
              this->ammo[6] = 0x28;
              this->ammo[5] = 1;
            }
          }
          else {
            this->armourtype = 1;
            this->armour = 100;
            for (local_20 = 0; local_20 < 5; local_20 = local_20 + 1) {
              baseammo(this,local_20 + 1,2,1);
            }
            this->gunselect = 2;
            this->ammo[2] = this->ammo[2] / 2;
          }
        }
        else {
          this->armourtype = 1;
          this->armour = 100;
          this->ammo[6] = 0x28;
          uVar1 = randomMT();
          iVar2 = (uVar1 & 0xffffff) % 5 + 1;
          this->gunselect = iVar2;
          bVar4 = false;
          if ((-4 < gamemode) && (bVar4 = false, gamemode < 0x17)) {
            bVar4 = (gamemodes[gamemode + 3].flags & 2U) != 0;
          }
          iVar3 = 1;
          if (bVar4) {
            iVar3 = 2;
          }
          baseammo(this,iVar2,iVar3,1);
          do {
            uVar1 = randomMT();
            iVar3 = (uVar1 & 0xffffff) % 5 + 1;
          } while (iVar2 == iVar3);
          bVar4 = false;
          if ((-4 < gamemode) && (bVar4 = false, gamemode < 0x17)) {
            bVar4 = (gamemodes[gamemode + 3].flags & 2U) != 0;
          }
          iVar2 = 1;
          if (bVar4) {
            iVar2 = 2;
          }
          baseammo(this,iVar3,iVar2,1);
          if (((-4 < gamemode) && (gamemode < 0x17)) && ((gamemodes[gamemode + 3].flags & 2U) != 0))
          {
            this->ammo[5] = this->ammo[5] + 1;
          }
        }
      }
      else {
        if (regenbluearmour != 0) {
          this->armourtype = 0;
          this->armour = 0x19;
        }
        this->gunselect = 6;
        this->ammo[6] = 0x28;
        this->ammo[5] = 1;
      }
    }
    else {
      this->armour = 0;
      this->health = 1;
      this->gunselect = 4;
      this->ammo[4] = 100;
    }
  }
  else {
    this->gunselect = 0;
  }
  return;
}

Assistant:

void spawnstate(int gamemode)
    {
        if(m_demo)
        {
            gunselect = GUN_FIST;
        }
        else if(m_insta)
        {
            armour = 0;
            health = 1;
            gunselect = GUN_RIFLE;
            ammo[GUN_RIFLE] = 100;
        }
        else if(m_regencapture)
        {
            extern int regenbluearmour;
            if(regenbluearmour)
            {
                armourtype = A_BLUE;
                armour = 25;
            }
            gunselect = GUN_PISTOL;
            ammo[GUN_PISTOL] = 40;
            ammo[GUN_GL] = 1;
        }
        else if(m_tactics)
        {
            armourtype = A_GREEN;
            armour = 100;
            ammo[GUN_PISTOL] = 40;
            int spawngun1 = rnd(5)+1, spawngun2;
            gunselect = spawngun1;
            baseammo(spawngun1, m_noitems ? 2 : 1);
            do spawngun2 = rnd(5)+1; while(spawngun1==spawngun2);
            baseammo(spawngun2, m_noitems ? 2 : 1);
            if(m_noitems) ammo[GUN_GL] += 1;
        }
        else if(m_efficiency)
        {
            armourtype = A_GREEN;
            armour = 100;
            loopi(5) baseammo(i+1);
            gunselect = GUN_CG;
            ammo[GUN_CG] /= 2;
        }
        else if(m_ctf || m_collect)
        {
            armourtype = A_BLUE;
            armour = 50;
            ammo[GUN_PISTOL] = 40;
            ammo[GUN_GL] = 1;
        }
        else if(m_sp)
        {
            if(m_dmsp)
            {
                armourtype = A_BLUE;
                armour = 25;
            }
            ammo[GUN_PISTOL] = 80;
            ammo[GUN_GL] = 1;
        }
        else
        {
            armourtype = A_BLUE;
            armour = 25;
            ammo[GUN_PISTOL] = 40;
            ammo[GUN_GL] = 1;
        }
    }